

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.h
# Opt level: O3

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxSteepPR(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *old)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int32_t iVar5;
  
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SPxPricer = (_func_int **)&PTR_getName_006a11e8;
  pSVar1 = (old->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_name = (old->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_name;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thesolver = pSVar1;
  uVar2 = *(undefined8 *)
           ((old->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 2);
  uVar3 = *(undefined8 *)
           ((old->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 4);
  uVar4 = *(undefined8 *)
           ((old->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 6);
  *(undefined8 *)
   (this->
   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thetolerance.m_backend.data._M_elems =
       *(undefined8 *)
        (old->
        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thetolerance.m_backend.data._M_elems;
  *(undefined8 *)
   ((this->
    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thetolerance.m_backend.data._M_elems + 2) = uVar2;
  *(undefined8 *)
   ((this->
    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thetolerance.m_backend.data._M_elems + 4) = uVar3;
  *(undefined8 *)
   ((this->
    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thetolerance.m_backend.data._M_elems + 6) = uVar4;
  *(undefined8 *)
   ((this->
    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thetolerance.m_backend.data._M_elems + 8) =
       *(undefined8 *)
        ((old->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 8);
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thetolerance.m_backend.exp =
       (old->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.exp;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thetolerance.m_backend.neg =
       (old->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.neg;
  iVar5 = (old->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thetolerance.m_backend.prec_elem;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thetolerance.m_backend.fpclass =
       (old->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thetolerance.m_backend.prec_elem = iVar5;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).compare.elements = (IdxElement *)0x0;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SPxPricer = (_func_int **)&PTR_getName_006a1488;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&this->workVec,&old->workVec);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&this->workRhs,&old->workRhs);
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  ::Array(&this->prices,0);
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  ::Array(&this->pricesCo,0);
  DIdxSet::DIdxSet(&this->bestPrices,8);
  DIdxSet::DIdxSet(&this->bestPricesCo,8);
  *(undefined8 *)((this->pi_p).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->pi_p).m_backend.data._M_elems + 8);
  uVar2 = *(undefined8 *)(old->pi_p).m_backend.data._M_elems;
  uVar3 = *(undefined8 *)((old->pi_p).m_backend.data._M_elems + 2);
  uVar4 = *(undefined8 *)((old->pi_p).m_backend.data._M_elems + 6);
  *(undefined8 *)((this->pi_p).m_backend.data._M_elems + 4) =
       *(undefined8 *)((old->pi_p).m_backend.data._M_elems + 4);
  *(undefined8 *)((this->pi_p).m_backend.data._M_elems + 6) = uVar4;
  *(undefined8 *)(this->pi_p).m_backend.data._M_elems = uVar2;
  *(undefined8 *)((this->pi_p).m_backend.data._M_elems + 2) = uVar3;
  (this->pi_p).m_backend.exp = (old->pi_p).m_backend.exp;
  (this->pi_p).m_backend.neg = (old->pi_p).m_backend.neg;
  iVar5 = (old->pi_p).m_backend.prec_elem;
  (this->pi_p).m_backend.fpclass = (old->pi_p).m_backend.fpclass;
  (this->pi_p).m_backend.prec_elem = iVar5;
  this->setup = old->setup;
  this->refined = old->refined;
  return;
}

Assistant:

SPxSteepPR(const SPxSteepPR& old)
      : SPxPricer<R>(old)
      , workVec(old.workVec)
      , workRhs(old.workRhs)
      , pi_p(old.pi_p)
      , setup(old.setup)
      , refined(old.refined)
   {
      assert(isConsistent());
   }